

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O1

UBool __thiscall icu_63::LocaleKey::isFallbackOf(LocaleKey *this,UnicodeString *id)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  int srcLength;
  uint uVar4;
  int srcStart;
  char16_t *srcChars;
  int iVar5;
  undefined4 length;
  bool bVar6;
  UnicodeString temp;
  UnicodeString local_50;
  
  UnicodeString::UnicodeString(&local_50,id);
  ICUServiceKey::parseSuffix(&local_50);
  uVar1 = (this->_primaryID).fUnion.fStackFields.fLengthAndFlags;
  length = local_50.fUnion.fFields.fLength;
  if (-1 < local_50.fUnion.fStackFields.fLengthAndFlags) {
    length = (int)local_50.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  iVar3 = -1;
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      iVar5 = (this->_primaryID).fUnion.fFields.fLength;
    }
    else {
      iVar5 = (int)(short)uVar1 >> 5;
    }
    srcStart = 0;
    if (iVar5 < 0) {
      srcStart = iVar5;
    }
    srcLength = iVar5 - srcStart;
    if (iVar5 <= iVar5 - srcStart) {
      srcLength = iVar5;
    }
    if (iVar5 < 0) {
      srcLength = 0;
    }
    if (0 < srcLength) {
      if ((uVar1 & 2) == 0) {
        srcChars = (this->_primaryID).fUnion.fFields.fArray;
      }
      else {
        srcChars = (this->_primaryID).fUnion.fStackFields.fBuffer;
      }
      iVar3 = UnicodeString::indexOf(&local_50,srcChars,srcStart,srcLength,0,length);
    }
  }
  if (iVar3 == 0) {
    if (-1 < local_50.fUnion.fStackFields.fLengthAndFlags) {
      local_50.fUnion.fFields.fLength = (int)local_50.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    sVar2 = (this->_primaryID).fUnion.fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      uVar4 = (this->_primaryID).fUnion.fFields.fLength;
    }
    else {
      uVar4 = (int)sVar2 >> 5;
    }
    bVar6 = true;
    if (local_50.fUnion.fFields.fLength == uVar4) goto LAB_002e8b6d;
    if (uVar4 < (uint)local_50.fUnion.fFields.fLength) {
      if (((int)local_50.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        local_50.fUnion.fFields.fArray = local_50.fUnion.fStackFields.fBuffer;
      }
      bVar6 = *(char16_t *)((long)local_50.fUnion.fFields.fArray + (long)(int)uVar4 * 2) == L'_';
      goto LAB_002e8b6d;
    }
  }
  bVar6 = false;
LAB_002e8b6d:
  UnicodeString::~UnicodeString(&local_50);
  return bVar6;
}

Assistant:

UBool
LocaleKey::isFallbackOf(const UnicodeString& id) const {
    UnicodeString temp(id);
    parseSuffix(temp);
    return temp.indexOf(_primaryID) == 0 &&
        (temp.length() == _primaryID.length() ||
        temp.charAt(_primaryID.length()) == UNDERSCORE_CHAR);
}